

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ReporterBase::ReporterBase(ReporterBase *this,ReporterConfig *config)

{
  int iVar1;
  IStream *pIVar2;
  undefined4 extraout_var;
  ReporterConfig *in_RSI;
  undefined8 *in_RDI;
  IStream *in_stack_00000040;
  ColourMode in_stack_0000004f;
  ReporterConfig *in_stack_ffffffffffffff98;
  IEventListener *in_stack_ffffffffffffffa0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  
  ReporterConfig::fullConfig(in_RSI);
  IEventListener::IEventListener(in_stack_ffffffffffffffa0,(IConfig *)in_stack_ffffffffffffff98);
  *in_RDI = &PTR__ReporterBase_002a66c8;
  ReporterConfig::takeStream(in_stack_ffffffffffffff98);
  pIVar2 = Detail::unique_ptr<Catch::IStream>::operator->
                     ((unique_ptr<Catch::IStream> *)(in_RDI + 3));
  iVar1 = (*pIVar2->_vptr_IStream[2])();
  in_RDI[4] = CONCAT44(extraout_var,iVar1);
  ReporterConfig::colourMode(in_RSI);
  Detail::unique_ptr<Catch::IStream>::get((unique_ptr<Catch::IStream> *)(in_RDI + 3));
  makeColourImpl(in_stack_0000004f,in_stack_00000040);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(in_RDI + 6);
  ReporterConfig::customOptions_abi_cxx11_(in_RSI);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

ReporterBase::ReporterBase( ReporterConfig&& config ):
        IEventListener( config.fullConfig() ),
        m_wrapped_stream( CATCH_MOVE(config).takeStream() ),
        m_stream( m_wrapped_stream->stream() ),
        m_colour( makeColourImpl( config.colourMode(), m_wrapped_stream.get() ) ),
        m_customOptions( config.customOptions() )
    {}